

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::MergeFrom
          (BayesianProbitRegressor_FeatureValueWeight *this,
          BayesianProbitRegressor_FeatureValueWeight *from)

{
  void *pvVar1;
  LogMessage *other;
  BayesianProbitRegressor_Gaussian *this_00;
  BayesianProbitRegressor_Gaussian *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x205);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (BayesianProbitRegressor_FeatureValueWeight *)
               &_BayesianProbitRegressor_FeatureValueWeight_default_instance_) &&
     (from->featureweight_ != (BayesianProbitRegressor_Gaussian *)0x0)) {
    this_00 = mutable_featureweight(this);
    from_00 = from->featureweight_;
    if (from_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
      from_00 = (BayesianProbitRegressor_Gaussian *)
                &_BayesianProbitRegressor_Gaussian_default_instance_;
    }
    BayesianProbitRegressor_Gaussian::MergeFrom(this_00,from_00);
  }
  if (from->featurevalue_ != 0) {
    this->featurevalue_ = from->featurevalue_;
  }
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureValueWeight::MergeFrom(const BayesianProbitRegressor_FeatureValueWeight& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_featureweight()) {
    mutable_featureweight()->::CoreML::Specification::BayesianProbitRegressor_Gaussian::MergeFrom(from.featureweight());
  }
  if (from.featurevalue() != 0) {
    set_featurevalue(from.featurevalue());
  }
}